

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_mul(secp256k1_fe *r,secp256k1_fe *a,secp256k1_fe *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint64_t uVar62;
  uint64_t uVar63;
  uint64_t uVar64;
  uint64_t uVar65;
  int iVar66;
  int iVar67;
  secp256k1_gej *psVar68;
  ulong uVar69;
  ulong uVar70;
  secp256k1_fe *a_00;
  ulong uVar71;
  secp256k1_gej *psVar72;
  secp256k1_gej *a_01;
  ulong uVar73;
  secp256k1_gej *psVar74;
  ulong uVar75;
  
  secp256k1_fe_verify(a);
  secp256k1_fe_verify(b);
  secp256k1_fe_verify_magnitude(a,8);
  psVar72 = (secp256k1_gej *)0x8;
  psVar74 = (secp256k1_gej *)b;
  secp256k1_fe_verify_magnitude(b,8);
  if (r == b) {
    secp256k1_fe_mul_cold_21();
LAB_00115e99:
    secp256k1_fe_mul_cold_20();
LAB_00115e9e:
    secp256k1_fe_mul_cold_19();
LAB_00115ea3:
    secp256k1_fe_mul_cold_18();
LAB_00115ea8:
    secp256k1_fe_mul_cold_17();
LAB_00115ead:
    secp256k1_fe_mul_cold_16();
LAB_00115eb2:
    secp256k1_fe_mul_cold_15();
LAB_00115eb7:
    secp256k1_fe_mul_cold_14();
LAB_00115ebc:
    secp256k1_fe_mul_cold_13();
LAB_00115ec1:
    secp256k1_fe_mul_cold_12();
LAB_00115ec6:
    secp256k1_fe_mul_cold_11();
    a_01 = psVar72;
    psVar68 = psVar74;
LAB_00115ecb:
    secp256k1_fe_mul_cold_10();
LAB_00115ed0:
    secp256k1_fe_mul_cold_9();
LAB_00115ed5:
    secp256k1_fe_mul_cold_8();
LAB_00115eda:
    r = &psVar68->x;
    secp256k1_fe_mul_cold_7();
LAB_00115edf:
    secp256k1_fe_mul_cold_6();
LAB_00115ee4:
    secp256k1_fe_mul_cold_5();
LAB_00115ee9:
    secp256k1_fe_mul_cold_4();
LAB_00115eee:
    secp256k1_fe_mul_cold_3();
  }
  else {
    if (a == b) goto LAB_00115e99;
    uVar69 = a->n[0];
    if (uVar69 >> 0x38 != 0) goto LAB_00115e9e;
    uVar70 = a->n[1];
    if (0xffffffffffffff < uVar70) goto LAB_00115ea3;
    psVar72 = (secp256k1_gej *)a->n[2];
    if ((secp256k1_gej *)0xffffffffffffff < psVar72) goto LAB_00115ea8;
    uVar71 = a->n[3];
    if (0xffffffffffffff < uVar71) goto LAB_00115ead;
    uVar73 = a->n[4];
    if (uVar73 >> 0x34 != 0) goto LAB_00115eb2;
    uVar75 = b->n[0];
    if (0xffffffffffffff < uVar75) goto LAB_00115eb7;
    uVar1 = b->n[1];
    if (0xffffffffffffff < uVar1) goto LAB_00115ebc;
    uVar2 = b->n[2];
    if (0xffffffffffffff < uVar2) goto LAB_00115ec1;
    psVar74 = (secp256k1_gej *)b->n[3];
    if ((secp256k1_gej *)0xffffffffffffff < psVar74) goto LAB_00115ec6;
    uVar3 = b->n[4];
    a_01 = psVar72;
    psVar68 = psVar74;
    if (0xfffffffffffff < uVar3) goto LAB_00115ecb;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = psVar74;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar69;
    psVar68 = SUB168(auVar4 * auVar35,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar2;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar70;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar1;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = psVar72;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar75;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar71;
    auVar4 = auVar4 * auVar35 + auVar5 * auVar36 + auVar7 * auVar38 + auVar6 * auVar37;
    a_01 = auVar4._8_8_;
    if ((ulong)a_01 >> 0x32 != 0) goto LAB_00115ed0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar3;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar73;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = SUB168(auVar8 * auVar39,0);
    auVar4 = auVar4 + auVar9 * ZEXT816(0x1000003d10);
    auVar6 = auVar4 >> 0x34;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar3;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar69;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = psVar74;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar70;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar2;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = psVar72;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar1;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar71;
    psVar68 = SUB168(auVar13 * auVar43,8);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar75;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar73;
    auVar5 = auVar11 * auVar41 + auVar12 * auVar42 + auVar14 * auVar44 + auVar13 * auVar43;
    auVar7 = auVar10 * auVar40 + auVar5;
    a_01 = (secp256k1_gej *)(auVar7._8_8_ + auVar6._8_8_ + (ulong)CARRY8(auVar7._0_8_,auVar6._0_8_))
    ;
    if ((ulong)a_01 >> 0x33 != 0) goto LAB_00115ed5;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = SUB168(auVar8 * auVar39,8);
    auVar5 = auVar15 * ZEXT816(0x1000003d10000) + auVar6 + auVar5 + auVar10 * auVar40;
    a_01 = SUB168(auVar5 >> 0x34,0);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar3;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar70;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = psVar74;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = psVar72;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar2;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar71;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar1;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar73;
    auVar6 = (auVar5 >> 0x34) +
             auVar17 * auVar46 + auVar19 * auVar48 + auVar18 * auVar47 + auVar16 * auVar45;
    psVar68 = SUB168(auVar17 * auVar46,0);
    if (0x3ffffffffffff < auVar6._8_8_) goto LAB_00115eda;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar75;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar69;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = auVar6._0_8_ * 0x10 & 0xfffffffffffff0U | (ulong)(auVar5._6_2_ & 0xf);
    auVar7 = auVar20 * auVar49 + auVar21 * ZEXT816(0x1000003d1);
    r->n[0] = auVar7._0_8_ & 0xfffffffffffff;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar69;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = b->n[1];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar70;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = b->n[0];
    auVar7 = auVar22 * auVar50 + (auVar7 >> 0x34) + auVar23 * auVar51;
    a_01 = auVar7._8_8_;
    if ((secp256k1_gej *)0x3ffffffffffff < a_01) goto LAB_00115edf;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = psVar72;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = b->n[4];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar71;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = b->n[3];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar73;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = b->n[2];
    auVar6 = auVar24 * auVar52 + (auVar6 >> 0x34) + auVar25 * auVar53 + auVar26 * auVar54;
    if (0x3ffffffffffff < auVar6._8_8_) goto LAB_00115ee4;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar7 = auVar7 + auVar27 * ZEXT816(0x1000003d10);
    r->n[1] = auVar7._0_8_ & 0xfffffffffffff;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar69;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = b->n[2];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar70;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = b->n[1];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = psVar72;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = b->n[0];
    auVar7 = auVar29 * auVar56 + auVar28 * auVar55 + (auVar7 >> 0x34) + auVar30 * auVar57;
    a_01 = auVar7._8_8_;
    if ((secp256k1_gej *)0x3ffffffffffff < a_01) goto LAB_00115ee9;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar71;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = b->n[4];
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar73;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = b->n[3];
    auVar6 = auVar31 * auVar58 + (auVar6 >> 0x34) + auVar32 * auVar59;
    uVar69 = auVar6._8_8_;
    if (0x3ffffffffffff < uVar69) goto LAB_00115eee;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = auVar6._0_8_;
    auVar7 = auVar7 + auVar33 * ZEXT816(0x1000003d10);
    auVar6 = auVar7 >> 0x34;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = auVar6._0_8_;
    r->n[2] = auVar7._0_8_ & 0xfffffffffffff;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar69;
    a_01 = auVar6._8_8_;
    auVar60._8_8_ = a_01;
    auVar60._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
    auVar61 = auVar34 * ZEXT816(0x1000003d10000) + auVar60 + auVar61;
    uVar69 = auVar61._0_8_;
    uVar70 = auVar61._8_8_;
    if (uVar70 >> 0x24 == 0) {
      r->n[3] = uVar69 & 0xfffffffffffff;
      uVar69 = (uVar70 << 0xc | uVar69 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
      r->n[4] = uVar69;
      if (uVar69 >> 0x31 == 0) {
        r->magnitude = 1;
        r->normalized = 0;
        secp256k1_fe_verify(r);
        return;
      }
      goto LAB_00115ef8;
    }
  }
  secp256k1_fe_mul_cold_2();
LAB_00115ef8:
  secp256k1_fe_mul_cold_1();
  secp256k1_gej_verify(a_01);
  if (a_01->infinity == 0) {
    if (a_00 != (secp256k1_fe *)0x0) {
      uVar62 = (a_01->y).n[0];
      uVar63 = (a_01->y).n[1];
      uVar64 = (a_01->y).n[2];
      uVar65 = (a_01->y).n[3];
      iVar66 = (a_01->y).magnitude;
      iVar67 = (a_01->y).normalized;
      a_00->n[4] = (a_01->y).n[4];
      a_00->magnitude = iVar66;
      a_00->normalized = iVar67;
      a_00->n[2] = uVar64;
      a_00->n[3] = uVar65;
      a_00->n[0] = uVar62;
      a_00->n[1] = uVar63;
      secp256k1_fe_verify(a_00);
      uVar69 = a_00->n[4];
      uVar71 = (uVar69 >> 0x30) * 0x1000003d1 + a_00->n[0];
      uVar70 = (uVar71 >> 0x34) + a_00->n[1];
      uVar73 = (uVar70 >> 0x34) + a_00->n[2];
      uVar75 = (uVar73 >> 0x34) + a_00->n[3];
      a_00->n[0] = uVar71 & 0xfffffffffffff;
      a_00->n[1] = uVar70 & 0xfffffffffffff;
      a_00->n[2] = uVar73 & 0xfffffffffffff;
      a_00->n[3] = uVar75 & 0xfffffffffffff;
      a_00->n[4] = (uVar75 >> 0x34) + (uVar69 & 0xffffffffffff);
      a_00->magnitude = 1;
      secp256k1_fe_verify(a_00);
    }
    secp256k1_gej_double((secp256k1_gej *)r,a_01);
    secp256k1_gej_verify((secp256k1_gej *)r);
    return;
  }
  secp256k1_gej_set_infinity((secp256k1_gej *)r);
  if (a_00 != (secp256k1_fe *)0x0) {
    a_00->n[0] = 1;
    a_00->n[1] = 0;
    a_00->n[2] = 0;
    a_00->n[3] = 0;
    a_00->n[4] = 0;
    a_00->magnitude = 1;
    a_00->normalized = 1;
    secp256k1_fe_verify(a_00);
    return;
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul(secp256k1_fe *r, const secp256k1_fe *a, const secp256k1_fe * SECP256K1_RESTRICT b) {
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(b);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 8);
    SECP256K1_FE_VERIFY_MAGNITUDE(b, 8);
    VERIFY_CHECK(r != b);
    VERIFY_CHECK(a != b);

    secp256k1_fe_impl_mul(r, a, b);
    r->magnitude = 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}